

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void Js::JavascriptArray::TypedArraySort<short>
               (short *list,uint32 length,CompareVarsInfo *cvInfo,ArenaAllocator *allocator)

{
  undefined1 local_28 [8];
  JsReentLock jsReentLock;
  
  local_28 = (undefined1  [8])cvInfo->scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_28)->noJsReentrancy;
  ((ThreadContext *)local_28)->noJsReentrancy = true;
  ((ThreadContext *)local_28)->noJsReentrancy = (bool)jsReentLock.m_arrayObject2._0_1_;
  if (length < 0x200) {
    InsertionSort<short>(list,length,cvInfo);
  }
  else {
    MergeSort<short>(list,length,cvInfo,allocator);
  }
  JsReentLock::MutateArrayObject((JsReentLock *)local_28);
  *(bool *)((long)local_28 + 0x108) = true;
  *(undefined1 *)((long)local_28 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return;
}

Assistant:

void JavascriptArray::TypedArraySort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo, ArenaAllocator* allocator)
    {
        ScriptContext* scriptContext = cvInfo->scriptContext;
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        if (length < 512)
        {
            JS_REENTRANT(jsReentLock, JavascriptArray::InsertionSort<T>(list, length, cvInfo));
        }
        else
        {
            JS_REENTRANT(jsReentLock, JavascriptArray::MergeSort<T>(list, length, cvInfo, allocator));
        }
    }